

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
::swap(dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
       *this,dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
             *ht)

{
  dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *in_RSI;
  dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *in_RDI;
  Settings *in_stack_00000008;
  Settings *in_stack_00000010;
  size_type in_stack_ffffffffffffffd8;
  
  std::
  swap<google::dense_hashtable<std::pair<int_const,int>,int_const,Hasher,google::dense_hash_map<int_const,int,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int_const,int,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::Settings>
            (in_stack_00000010,in_stack_00000008);
  std::
  swap<google::dense_hashtable<std::pair<int_const,int>,int_const,Hasher,google::dense_hash_map<int_const,int,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int_const,int,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::KeyInfo>
            (&in_RDI->key_info,&in_RSI->key_info);
  std::swap<unsigned_long>(&in_RDI->num_deleted,&in_RSI->num_deleted);
  std::swap<unsigned_long>(&in_RDI->num_elements,&in_RSI->num_elements);
  std::swap<unsigned_long>(&in_RDI->num_buckets,&in_RSI->num_buckets);
  std::swap<std::pair<int_const,int>*>(&in_RDI->table,&in_RSI->table);
  bucket_count(in_RDI);
  sparsehash_internal::sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>::reset_thresholds
            ((sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4> *)in_RDI,
             in_stack_ffffffffffffffd8);
  bucket_count(in_RSI);
  sparsehash_internal::sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>::reset_thresholds
            ((sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4> *)in_RDI,
             in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void swap(dense_hashtable& ht) {
    std::swap(settings, ht.settings);
    std::swap(key_info, ht.key_info);
    std::swap(num_deleted, ht.num_deleted);
    std::swap(num_elements, ht.num_elements);
    std::swap(num_buckets, ht.num_buckets);
    std::swap(table, ht.table);
    settings.reset_thresholds(bucket_count());  // also resets consider_shrink
    ht.settings.reset_thresholds(ht.bucket_count());
    // we purposefully don't swap the allocator, which may not be swap-able
  }